

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O0

MPP_RET mpp_trie_init_by_root(MppTrie *trie,void *root)

{
  undefined8 *trie_00;
  MppTrieInfo *pMVar1;
  void *pvVar2;
  undefined4 *puVar3;
  char *name_00;
  MppTrieInfo *pMVar4;
  uint local_6c;
  MppTrieInfo *info_ret;
  MppTrieInfo *info_set;
  char *name;
  MppTrieInfo *pMStack_30;
  RK_S32 i;
  MppTrieInfo *info;
  MppTrieImpl *p;
  void *root_local;
  MppTrie *trie_local;
  
  if ((trie == (MppTrie *)0x0) || (root == (void *)0x0)) {
    _mpp_log_l(2,"mpp_trie","invalid trie %px root %px\n","mpp_trie_init_by_root",trie,root);
    trie_local._4_4_ = MPP_NOK;
  }
  else {
    *trie = (MppTrie)0x0;
    trie_00 = (undefined8 *)mpp_osal_calloc("mpp_trie_init_by_root",0x58);
    if (trie_00 == (undefined8 *)0x0) {
      _mpp_log_l(2,"mpp_trie","create trie impl failed\n","mpp_trie_init_by_root");
      trie_local._4_4_ = MPP_NOK;
    }
    else {
      pMVar1 = mpp_trie_get_info_from_root(root,"__name__");
      if (pMVar1 != (MppTrieInfo *)0x0) {
        pvVar2 = mpp_trie_info_ctx(pMVar1);
        *trie_00 = pvVar2;
      }
      pMVar1 = mpp_trie_get_info_from_root(root,"__node__");
      if (pMVar1 != (MppTrieInfo *)0x0) {
        puVar3 = (undefined4 *)mpp_trie_info_ctx(pMVar1);
        *(undefined4 *)((long)trie_00 + 0x2c) = *puVar3;
      }
      pMVar1 = mpp_trie_get_info_from_root(root,"__info__");
      if (pMVar1 != (MppTrieInfo *)0x0) {
        puVar3 = (undefined4 *)mpp_trie_info_ctx(pMVar1);
        *(undefined4 *)(trie_00 + 3) = *puVar3;
      }
      trie_00[6] = root;
      if ((mpp_trie_debug & 0x100) != 0) {
        mpp_trie_dump(trie_00,"root import");
      }
      pMStack_30 = mpp_trie_get_info_first(trie_00);
      for (name._4_4_ = 0; (int)name._4_4_ < *(int *)(trie_00 + 3); name._4_4_ = name._4_4_ + 1) {
        name_00 = mpp_trie_info_name(pMStack_30);
        pMVar1 = mpp_trie_get_info(trie_00,name_00);
        pMVar4 = mpp_trie_get_info_next(trie_00,pMStack_30);
        if (((pMVar1 == (MppTrieInfo *)0x0) || (pMStack_30 != pMVar1)) ||
           (((uint)*pMVar1 & 0xfff) != name._4_4_)) {
          if (pMVar1 == (MppTrieInfo *)0x0) {
            local_6c = 0xffffffff;
          }
          else {
            local_6c = (uint)*pMVar1 & 0xfff;
          }
          _mpp_log_l(2,"mpp_trie","trie check on import found mismatch info %s [%d:%p] - [%d:%p]\n",
                     "mpp_trie_init_by_root",name_00,(ulong)name._4_4_,pMStack_30,local_6c,pMVar1);
          return MPP_NOK;
        }
        pMStack_30 = pMVar4;
      }
      *trie = trie_00;
      trie_local._4_4_ = MPP_OK;
    }
  }
  return trie_local._4_4_;
}

Assistant:

MPP_RET mpp_trie_init_by_root(MppTrie *trie, void *root)
{
    MppTrieImpl *p;
    MppTrieInfo *info;
    RK_S32 i;

    if (!trie || !root) {
        mpp_loge_f("invalid trie %px root %px\n", trie, root);
        return MPP_NOK;
    }

    *trie = NULL;
    p = mpp_calloc_size(MppTrieImpl, sizeof(MppTrieImpl));
    if (!p) {
        mpp_err_f("create trie impl failed\n");
        return MPP_NOK;
    }

    info = mpp_trie_get_info_from_root(root, "__name__");
    if (info)
        p->name = (char *)mpp_trie_info_ctx(info);

    info = mpp_trie_get_info_from_root(root, "__node__");
    if (info)
        p->node_used = *(RK_U32 *)mpp_trie_info_ctx(info);

    info = mpp_trie_get_info_from_root(root, "__info__");
    if (info)
        p->info_used = *(RK_U32 *)mpp_trie_info_ctx(info);

    /* import and update new buffer */
    p->nodes = (MppTrieNode *)root;

    if (mpp_trie_debug & MPP_TRIE_DBG_IMPORT)
        mpp_trie_dump(p, "root import");

    info = mpp_trie_get_info_first(p);

    for (i = 0; i < p->info_used; i++) {
        const char *name = mpp_trie_info_name(info);
        MppTrieInfo *info_set = info;
        MppTrieInfo *info_ret = mpp_trie_get_info(p, name);

        info = mpp_trie_get_info_next(p, info);

        if (info_ret && info_set == info_ret && info_ret->index == i)
            continue;

        mpp_loge_f("trie check on import found mismatch info %s [%d:%p] - [%d:%p]\n",
                   name, i, info_set, info_ret ? info_ret->index : -1, info_ret);
        return MPP_NOK;
    }

    *trie = p;

    return MPP_OK;
}